

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  GridSOA *pGVar5;
  GridSOA *pGVar6;
  GridSOA *pGVar7;
  float *pfVar8;
  GridSOA *pGVar9;
  GridSOA *pGVar10;
  GridSOA *pGVar11;
  float *pfVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  GridSOA *pGVar17;
  Geometry *pGVar18;
  size_t sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  long lVar28;
  long lVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  RTCRayN *pRVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  undefined4 uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  undefined1 auVar40 [8];
  GridSOA *pGVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  float fVar50;
  float fVar81;
  float fVar82;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar83;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar80;
  uint uVar84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  uint uVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar101;
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  float fVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar106;
  float fVar113;
  float fVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uint uVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  float fVar129;
  float fVar130;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar119;
  float fVar131;
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar140;
  float fVar141;
  float fVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar168;
  float fVar169;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar180;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar209;
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [16];
  float fVar211;
  float fVar214;
  float fVar217;
  undefined1 auVar208 [16];
  undefined8 local_1308;
  undefined8 uStack_1300;
  float old_t;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  float local_12d8;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  float fStack_12ac;
  float fStack_128c;
  undefined8 local_1288;
  vbool<4> valid;
  undefined1 local_1268 [16];
  Precalculations *local_1258;
  GridSOA *local_1250;
  ulong local_1248;
  ulong local_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1178 [4];
  float local_1168 [4];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined8 local_1108;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  uint local_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar144 [16];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar49 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar203 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar50 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar81 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar112 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar33 = (tray->tnear).field_0.i[k];
  auVar61._4_4_ = iVar33;
  auVar61._0_4_ = iVar33;
  auVar61._8_4_ = iVar33;
  auVar61._12_4_ = iVar33;
  iVar33 = (tray->tfar).field_0.i[k];
  auVar135._4_4_ = iVar33;
  auVar135._0_4_ = iVar33;
  auVar135._8_4_ = iVar33;
  auVar135._12_4_ = iVar33;
  lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_fd8 = fVar49;
  fStack_fd4 = fVar49;
  fStack_fd0 = fVar49;
  fStack_fcc = fVar49;
  local_fe8 = fVar203;
  fStack_fe4 = fVar203;
  fStack_fe0 = fVar203;
  fStack_fdc = fVar203;
  local_ff8 = fVar50;
  fStack_ff4 = fVar50;
  fStack_ff0 = fVar50;
  fStack_fec = fVar50;
  local_1008 = fVar81;
  fStack_1004 = fVar81;
  fStack_1000 = fVar81;
  fStack_ffc = fVar81;
  local_1018 = fVar82;
  fStack_1014 = fVar82;
  fStack_1010 = fVar82;
  fStack_100c = fVar82;
  local_1028 = fVar112;
  fStack_1024 = fVar112;
  fStack_1020 = fVar112;
  fStack_101c = fVar112;
  local_1038 = auVar61;
  local_1258 = pre;
  fVar166 = fVar112;
  fVar165 = fVar112;
  fVar162 = fVar112;
  fVar158 = fVar82;
  fVar154 = fVar82;
  fVar159 = fVar82;
  fVar157 = fVar81;
  fVar153 = fVar81;
  fVar113 = fVar81;
  fVar155 = fVar50;
  fVar147 = fVar50;
  fVar141 = fVar50;
  fVar101 = fVar203;
  fVar131 = fVar203;
  fVar130 = fVar203;
  fVar129 = fVar49;
  fVar116 = fVar49;
  fVar115 = fVar49;
LAB_002904f2:
  do {
    pSVar27 = pSVar30 + -1;
    pSVar30 = pSVar30 + -1;
    if ((float)pSVar27->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar27->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar34 = (pSVar30->ptr).ptr;
      while ((uVar34 & 8) == 0) {
        uVar36 = uVar34 & 0xfffffffffffffff0;
        fVar167 = *(float *)(ray + k * 4 + 0x70);
        pfVar12 = (float *)(uVar36 + 0x80 + uVar42);
        pfVar8 = (float *)(uVar36 + 0x20 + uVar42);
        auVar104._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar115) * fVar113;
        auVar104._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar116) * fVar153;
        auVar104._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar129) * fVar157;
        auVar104._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar49) * fVar81;
        auVar104 = maxps(auVar61,auVar104);
        pfVar12 = (float *)(uVar36 + 0x80 + uVar43);
        pfVar8 = (float *)(uVar36 + 0x20 + uVar43);
        auVar117._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar130) * fVar159;
        auVar117._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar131) * fVar154;
        auVar117._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar101) * fVar158;
        auVar117._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar203) * fVar82;
        pfVar12 = (float *)(uVar36 + 0x80 + uVar38);
        pfVar8 = (float *)(uVar36 + 0x20 + uVar38);
        auVar139._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar141) * fVar162;
        auVar139._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar147) * fVar165;
        auVar139._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar155) * fVar166;
        auVar139._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar50) * fVar112;
        auVar117 = maxps(auVar117,auVar139);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar104,auVar117);
        pfVar12 = (float *)(uVar36 + 0x80 + (uVar42 ^ 0x10));
        pfVar8 = (float *)(uVar36 + 0x20 + (uVar42 ^ 0x10));
        auVar143._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar115) * fVar113;
        auVar143._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar116) * fVar153;
        auVar143._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar129) * fVar157;
        auVar143._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar49) * fVar81;
        pfVar12 = (float *)(uVar36 + 0x80 + (uVar43 ^ 0x10));
        pfVar8 = (float *)(uVar36 + 0x20 + (uVar43 ^ 0x10));
        auVar137._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar130) * fVar159;
        auVar137._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar131) * fVar154;
        auVar137._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar101) * fVar158;
        auVar137._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar203) * fVar82;
        pfVar12 = (float *)(uVar36 + 0x80 + (uVar38 ^ 0x10));
        pfVar8 = (float *)(uVar36 + 0x20 + (uVar38 ^ 0x10));
        auVar183._0_4_ = ((*pfVar12 * fVar167 + *pfVar8) - fVar141) * fVar162;
        auVar183._4_4_ = ((pfVar12[1] * fVar167 + pfVar8[1]) - fVar147) * fVar165;
        auVar183._8_4_ = ((pfVar12[2] * fVar167 + pfVar8[2]) - fVar155) * fVar166;
        auVar183._12_4_ = ((pfVar12[3] * fVar167 + pfVar8[3]) - fVar50) * fVar112;
        auVar117 = minps(auVar137,auVar183);
        auVar104 = minps(auVar135,auVar143);
        auVar104 = minps(auVar104,auVar117);
        uVar32 = (uint)uVar34 & 7;
        if (uVar32 == 6) {
          bVar20 = (fVar167 < *(float *)(uVar36 + 0xf0) && *(float *)(uVar36 + 0xe0) <= fVar167) &&
                   tNear.field_0._0_4_ <= auVar104._0_4_;
          bVar21 = (fVar167 < *(float *)(uVar36 + 0xf4) && *(float *)(uVar36 + 0xe4) <= fVar167) &&
                   tNear.field_0._4_4_ <= auVar104._4_4_;
          bVar22 = (fVar167 < *(float *)(uVar36 + 0xf8) && *(float *)(uVar36 + 0xe8) <= fVar167) &&
                   tNear.field_0._8_4_ <= auVar104._8_4_;
          bVar23 = (fVar167 < *(float *)(uVar36 + 0xfc) && *(float *)(uVar36 + 0xec) <= fVar167) &&
                   tNear.field_0._12_4_ <= auVar104._12_4_;
        }
        else {
          bVar20 = tNear.field_0._0_4_ <= auVar104._0_4_;
          bVar21 = tNear.field_0._4_4_ <= auVar104._4_4_;
          bVar22 = tNear.field_0._8_4_ <= auVar104._8_4_;
          bVar23 = tNear.field_0._12_4_ <= auVar104._12_4_;
        }
        auVar51._0_4_ = (uint)bVar20 * -0x80000000;
        auVar51._4_4_ = (uint)bVar21 * -0x80000000;
        auVar51._8_4_ = (uint)bVar22 * -0x80000000;
        auVar51._12_4_ = (uint)bVar23 * -0x80000000;
        uVar32 = movmskps(uVar32,auVar51);
        if (uVar32 == 0) {
          if (pSVar30 == stack) {
            return;
          }
          goto LAB_002904f2;
        }
        uVar32 = uVar32 & 0xff;
        lVar39 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
          }
        }
        uVar34 = *(ulong *)(uVar36 + lVar39 * 8);
        uVar32 = uVar32 - 1 & uVar32;
        if (uVar32 != 0) {
          uVar84 = tNear.field_0.i[lVar39];
          lVar39 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar37 = *(ulong *)(uVar36 + lVar39 * 8);
          uVar100 = tNear.field_0.i[lVar39];
          uVar32 = uVar32 - 1 & uVar32;
          if (uVar32 == 0) {
            if (uVar84 < uVar100) {
              (pSVar30->ptr).ptr = uVar37;
              pSVar30->dist = uVar100;
              pSVar30 = pSVar30 + 1;
            }
            else {
              (pSVar30->ptr).ptr = uVar34;
              pSVar30->dist = uVar84;
              pSVar30 = pSVar30 + 1;
              uVar34 = uVar37;
            }
          }
          else {
            auVar105._8_4_ = uVar84;
            auVar105._0_8_ = uVar34;
            auVar105._12_4_ = 0;
            auVar132._8_4_ = uVar100;
            auVar132._0_8_ = uVar37;
            auVar132._12_4_ = 0;
            lVar39 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar16 = *(undefined8 *)(uVar36 + lVar39 * 8);
            iVar33 = tNear.field_0.i[lVar39];
            auVar118._8_4_ = iVar33;
            auVar118._0_8_ = uVar16;
            auVar118._12_4_ = 0;
            auVar52._8_4_ = -(uint)((int)uVar84 < (int)uVar100);
            uVar32 = uVar32 - 1 & uVar32;
            if (uVar32 == 0) {
              auVar52._4_4_ = auVar52._8_4_;
              auVar52._0_4_ = auVar52._8_4_;
              auVar52._12_4_ = auVar52._8_4_;
              auVar138._8_4_ = uVar100;
              auVar138._0_8_ = uVar37;
              auVar138._12_4_ = 0;
              auVar183 = blendvps(auVar138,auVar105,auVar52);
              auVar104 = blendvps(auVar105,auVar132,auVar52);
              auVar53._8_4_ = -(uint)(auVar183._8_4_ < iVar33);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar133._8_4_ = iVar33;
              auVar133._0_8_ = uVar16;
              auVar133._12_4_ = 0;
              auVar117 = blendvps(auVar133,auVar183,auVar53);
              auVar183 = blendvps(auVar183,auVar118,auVar53);
              auVar54._8_4_ = -(uint)(auVar104._8_4_ < auVar183._8_4_);
              auVar54._4_4_ = auVar54._8_4_;
              auVar54._0_4_ = auVar54._8_4_;
              auVar54._12_4_ = auVar54._8_4_;
              SVar119 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar183,auVar104,auVar54);
              SVar106 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar104,auVar183,auVar54);
              *pSVar30 = SVar106;
              pSVar30[1] = SVar119;
              uVar34 = auVar117._0_8_;
              pSVar30 = pSVar30 + 2;
            }
            else {
              lVar39 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              auVar55._4_4_ = auVar52._8_4_;
              auVar55._0_4_ = auVar52._8_4_;
              auVar55._8_4_ = auVar52._8_4_;
              auVar55._12_4_ = auVar52._8_4_;
              auVar139 = blendvps(auVar132,auVar105,auVar55);
              auVar104 = blendvps(auVar105,auVar132,auVar55);
              auVar142._8_4_ = tNear.field_0.i[lVar39];
              auVar142._0_8_ = *(undefined8 *)(uVar36 + lVar39 * 8);
              auVar142._12_4_ = 0;
              auVar56._8_4_ = -(uint)(iVar33 < tNear.field_0.i[lVar39]);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar183 = blendvps(auVar142,auVar118,auVar56);
              auVar117 = blendvps(auVar118,auVar142,auVar56);
              auVar57._8_4_ = -(uint)(auVar104._8_4_ < auVar117._8_4_);
              auVar57._4_4_ = auVar57._8_4_;
              auVar57._0_4_ = auVar57._8_4_;
              auVar57._12_4_ = auVar57._8_4_;
              auVar143 = blendvps(auVar117,auVar104,auVar57);
              SVar106 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar104,auVar117,auVar57);
              auVar58._8_4_ = -(uint)(auVar139._8_4_ < auVar183._8_4_);
              auVar58._4_4_ = auVar58._8_4_;
              auVar58._0_4_ = auVar58._8_4_;
              auVar58._12_4_ = auVar58._8_4_;
              auVar104 = blendvps(auVar183,auVar139,auVar58);
              auVar117 = blendvps(auVar139,auVar183,auVar58);
              auVar59._8_4_ = -(uint)(auVar117._8_4_ < auVar143._8_4_);
              auVar59._4_4_ = auVar59._8_4_;
              auVar59._0_4_ = auVar59._8_4_;
              auVar59._12_4_ = auVar59._8_4_;
              SVar119 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar143,auVar117,auVar59);
              SVar140 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar117,auVar143,auVar59);
              *pSVar30 = SVar106;
              pSVar30[1] = SVar140;
              pSVar30[2] = SVar119;
              uVar34 = auVar104._0_8_;
              pSVar30 = pSVar30 + 3;
            }
          }
        }
      }
      if (((uint)uVar34 & 0xf) == 8) {
        pGVar17 = (local_1258->super_Precalculations).grid;
        uVar36 = (ulong)*(uint *)(pGVar17 + 0xc);
        fVar203 = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar17 + 8) - 1);
        auVar87 = roundss(auVar135,ZEXT416((uint)fVar203),9);
        fVar49 = (float)(*(int *)(pGVar17 + 8) - 1) + -1.0;
        if (fVar49 <= auVar87._0_4_) {
          auVar87._0_4_ = fVar49;
        }
        fVar49 = 0.0;
        if (0.0 <= auVar87._0_4_) {
          fVar49 = auVar87._0_4_;
        }
        fVar203 = fVar203 - fVar49;
        lVar39 = (long)(int)fVar49 * (ulong)*(uint *)(pGVar17 + 0x28) +
                 (ulong)*(uint *)(pGVar17 + 0x24);
        uVar32 = *(uint *)(pGVar17 + 0x28) >> 2;
        uVar37 = (ulong)*(uint *)(pGVar17 + 0x14);
        lVar28 = (uVar34 >> 4) * 4 + lVar39;
        lVar39 = (uVar34 >> 4) * 4 + lVar39;
        pGVar41 = pGVar17 + lVar39 + 0x2c;
        pGVar9 = pGVar17 + uVar37 * 4 + lVar28 + 0x2c;
        pGVar10 = pGVar17 + uVar37 * 8 + lVar28 + 0x2c;
        fVar49 = *(float *)(pGVar17 + lVar39 + 0x30);
        pGVar11 = pGVar17 + uVar36 * 4 + lVar28 + 0x2c;
        fVar50 = *(float *)(pGVar11 + 4);
        if (uVar36 == 2) {
          uStack_1300._0_4_ = fVar50;
          local_1308 = *(undefined8 *)pGVar11;
          uStack_1300._4_4_ = fVar50;
          fVar81 = *(float *)pGVar9;
          fVar82 = *(float *)(pGVar9 + 4);
          fVar112 = *(float *)(pGVar9 + 8);
          fVar115 = *(float *)(pGVar9 + 0xc);
          fStack_12f4 = fVar82;
          old_t = fVar82;
          fStack_12f0 = fVar82;
          fStack_12ec = fVar82;
          uStack_12e0._0_4_ = fVar115;
          local_12e8 = *(undefined8 *)(pGVar9 + 8);
          uStack_12e0._4_4_ = fVar115;
          fVar116 = *(float *)pGVar10;
          fVar129 = *(float *)(pGVar10 + 4);
          fVar130 = *(float *)(pGVar10 + 8);
          fVar131 = *(float *)(pGVar10 + 0xc);
          uVar34 = (ulong)(uVar32 << 2);
          fVar101 = *(float *)(pGVar41 + uVar34);
          fVar141 = *(float *)(pGVar41 + uVar34 + 4);
          fVar147 = *(float *)(pGVar41 + uVar34 + 8);
          fVar155 = *(float *)(pGVar41 + uVar34 + 0xc);
          fVar113 = *(float *)(pGVar9 + uVar34);
          fVar153 = *(float *)(pGVar9 + uVar34 + 4);
          fVar157 = *(float *)(pGVar9 + uVar34 + 8);
          fVar159 = *(float *)(pGVar9 + uVar34 + 0xc);
          fVar154 = *(float *)(pGVar10 + uVar34);
          fVar158 = *(float *)(pGVar10 + uVar34 + 4);
          fVar162 = *(float *)(pGVar10 + uVar34 + 8);
          fVar165 = *(float *)(pGVar10 + uVar34 + 0xc);
          fVar166 = fVar129;
          fVar167 = fVar155;
          fVar168 = fVar153;
          fVar169 = fVar159;
          fVar175 = fVar158;
          fVar177 = fVar165;
          fVar174 = fVar141;
          fStack_12ac = fVar49;
          fStack_128c = fVar131;
        }
        else {
          uStack_1300._0_4_ = fVar50;
          local_1308 = *(undefined8 *)pGVar11;
          uStack_1300._4_4_ = *(float *)(pGVar11 + 8);
          fVar81 = *(float *)pGVar9;
          fVar82 = *(float *)(pGVar9 + 4);
          pGVar1 = pGVar9 + uVar36 * 4;
          fVar112 = *(float *)pGVar1;
          fVar115 = *(float *)(pGVar1 + 4);
          fStack_12f4 = fVar82;
          old_t = fVar82;
          fStack_12f0 = (float)*(undefined4 *)(pGVar9 + 8);
          fStack_12ec = (float)*(undefined4 *)(pGVar9 + 8);
          uStack_12e0._0_4_ = fVar115;
          local_12e8 = *(undefined8 *)pGVar1;
          uStack_12e0._4_4_ = (float)*(undefined4 *)(pGVar1 + 8);
          fVar116 = *(float *)pGVar10;
          fVar129 = *(float *)(pGVar10 + 4);
          pGVar1 = pGVar10 + uVar36 * 4;
          fVar130 = *(float *)pGVar1;
          fVar131 = *(float *)(pGVar1 + 4);
          uVar34 = (ulong)(uVar32 << 2);
          pGVar2 = pGVar41 + uVar34;
          fVar101 = *(float *)pGVar2;
          fVar141 = *(float *)(pGVar2 + 4);
          pGVar3 = pGVar41 + uVar36 * 4 + uVar34;
          fVar147 = *(float *)pGVar3;
          fVar155 = *(float *)(pGVar3 + 4);
          pGVar4 = pGVar9 + uVar34;
          fVar113 = *(float *)pGVar4;
          fVar153 = *(float *)(pGVar4 + 8);
          pGVar9 = pGVar9 + uVar36 * 4 + uVar34;
          fVar157 = *(float *)pGVar9;
          fVar159 = *(float *)(pGVar9 + 4);
          pGVar5 = pGVar10 + uVar34;
          fVar154 = *(float *)pGVar5;
          fVar158 = *(float *)(pGVar5 + 4);
          pGVar6 = pGVar10 + uVar36 * 4 + uVar34;
          fVar162 = *(float *)pGVar6;
          fVar165 = *(float *)(pGVar6 + 4);
          fVar166 = *(float *)(pGVar10 + 8);
          fVar167 = *(float *)(pGVar3 + 8);
          fVar168 = *(float *)(pGVar4 + 4);
          fVar169 = *(float *)(pGVar9 + 8);
          fVar175 = *(float *)(pGVar5 + 8);
          fVar177 = *(float *)(pGVar6 + 8);
          fVar174 = *(float *)(pGVar2 + 8);
          fStack_12ac = *(float *)(pGVar17 + lVar39 + 0x34);
          fStack_128c = *(float *)(pGVar1 + 8);
        }
        uVar32 = *(uint *)(pGVar17 + 0x10);
        local_1240 = (ulong)uVar32;
        local_1250 = pGVar17 + uVar37 * 0xc + lVar28 + 0x2c;
        local_10d8 = 1.0 - fVar203;
        fStack_10d4 = local_10d8;
        fStack_10d0 = local_10d8;
        fStack_10cc = local_10d8;
        fVar156 = *(float *)(ray + k * 4);
        fVar160 = *(float *)(ray + k * 4 + 0x10);
        fVar83 = *(float *)(ray + k * 4 + 0x20);
        fVar161 = *(float *)(ray + k * 4 + 0x40);
        fVar180 = (*(float *)pGVar41 * local_10d8 + fVar101 * fVar203) - fVar156;
        fVar185 = (*(float *)pGVar11 * local_10d8 + fVar147 * fVar203) - fVar156;
        fVar186 = (fVar49 * local_10d8 + fVar141 * fVar203) - fVar156;
        fVar187 = (fVar50 * local_10d8 + fVar155 * fVar203) - fVar156;
        fVar101 = (fVar81 * local_10d8 + fVar113 * fVar203) - fVar160;
        fVar112 = (fVar112 * local_10d8 + fVar157 * fVar203) - fVar160;
        fVar113 = (fVar82 * local_10d8 + fVar168 * fVar203) - fVar160;
        fVar115 = (fVar115 * local_10d8 + fVar159 * fVar203) - fVar160;
        local_1238._0_4_ = (fVar116 * local_10d8 + fVar154 * fVar203) - fVar83;
        local_1238._4_4_ = (fVar130 * local_10d8 + fVar162 * fVar203) - fVar83;
        fStack_1230 = (fVar129 * local_10d8 + fVar158 * fVar203) - fVar83;
        fStack_122c = (fVar131 * local_10d8 + fVar165 * fVar203) - fVar83;
        fVar204 = (fVar49 * local_10d8 + fVar141 * fVar203) - fVar156;
        fVar209 = (fVar49 * local_10d8 + fVar141 * fVar203) - fVar156;
        fVar212 = (fStack_12ac * local_10d8 + fVar174 * fVar203) - fVar156;
        fVar215 = (fStack_12ac * local_10d8 + fVar174 * fVar203) - fVar156;
        fVar188 = (old_t * local_10d8 + fVar168 * fVar203) - fVar160;
        fVar191 = (fStack_12f4 * local_10d8 + fVar168 * fVar203) - fVar160;
        fVar192 = (fStack_12f0 * local_10d8 + fVar153 * fVar203) - fVar160;
        fVar193 = (fStack_12ec * local_10d8 + fVar153 * fVar203) - fVar160;
        fVar168 = (fVar129 * local_10d8 + fVar158 * fVar203) - fVar83;
        fVar174 = (fVar129 * local_10d8 + fVar158 * fVar203) - fVar83;
        fVar176 = (fVar166 * local_10d8 + fVar175 * fVar203) - fVar83;
        fVar178 = (fVar166 * local_10d8 + fVar175 * fVar203) - fVar83;
        fVar153 = ((float)local_1308 * local_10d8 + fVar147 * fVar203) - fVar156;
        fVar154 = (local_1308._4_4_ * local_10d8 + fVar155 * fVar203) - fVar156;
        fVar155 = ((float)uStack_1300 * local_10d8 + fVar155 * fVar203) - fVar156;
        fVar156 = (uStack_1300._4_4_ * local_10d8 + fVar167 * fVar203) - fVar156;
        fVar157 = ((float)local_12e8 * local_10d8 + fVar157 * fVar203) - fVar160;
        fVar158 = (local_12e8._4_4_ * local_10d8 + fVar159 * fVar203) - fVar160;
        fVar159 = ((float)uStack_12e0 * local_10d8 + fVar159 * fVar203) - fVar160;
        fVar160 = (uStack_12e0._4_4_ * local_10d8 + fVar169 * fVar203) - fVar160;
        fVar50 = (fVar130 * local_10d8 + fVar162 * fVar203) - fVar83;
        fVar81 = (fVar131 * local_10d8 + fVar165 * fVar203) - fVar83;
        fVar82 = (fVar131 * local_10d8 + fVar165 * fVar203) - fVar83;
        fVar83 = (fStack_128c * local_10d8 + fVar177 * fVar203) - fVar83;
        local_10e8._0_4_ = fVar153 - fVar180;
        local_10e8._4_4_ = fVar154 - fVar185;
        fStack_10e0 = fVar155 - fVar186;
        fStack_10dc = fVar156 - fVar187;
        fVar194 = fVar157 - fVar101;
        fVar197 = fVar158 - fVar112;
        fStack_1100 = fVar159 - fVar113;
        fStack_10fc = fVar160 - fVar115;
        local_10f8 = fVar50 - (float)local_1238._0_4_;
        fStack_10f4 = fVar81 - (float)local_1238._4_4_;
        fStack_10f0 = fVar82 - fStack_1230;
        fStack_10ec = fVar83 - fStack_122c;
        fVar49 = *(float *)(ray + k * 4 + 0x50);
        local_1108 = (GridSOA *)CONCAT44(fVar197,fVar194);
        local_1118 = *(float *)(ray + k * 4 + 0x60);
        fVar162 = fVar180 - fVar204;
        fVar165 = fVar185 - fVar209;
        fVar166 = fVar186 - fVar212;
        fVar167 = fVar187 - fVar215;
        fVar141 = (fVar194 * (fVar50 + (float)local_1238._0_4_) - (fVar157 + fVar101) * local_10f8)
                  * fVar161 +
                  ((fVar153 + fVar180) * local_10f8 -
                  (fVar50 + (float)local_1238._0_4_) * (float)local_10e8._0_4_) * fVar49 +
                  ((float)local_10e8._0_4_ * (fVar157 + fVar101) - (fVar153 + fVar180) * fVar194) *
                  local_1118;
        fVar147 = (fVar197 * (fVar81 + (float)local_1238._4_4_) - (fVar158 + fVar112) * fStack_10f4)
                  * fVar161 +
                  ((fVar154 + fVar185) * fStack_10f4 -
                  (fVar81 + (float)local_1238._4_4_) * (float)local_10e8._4_4_) * fVar49 +
                  ((float)local_10e8._4_4_ * (fVar158 + fVar112) - (fVar154 + fVar185) * fVar197) *
                  local_1118;
        auVar144._0_8_ = CONCAT44(fVar147,fVar141);
        auVar144._8_4_ =
             (fStack_1100 * (fVar82 + fStack_1230) - (fVar159 + fVar113) * fStack_10f0) * fVar161 +
             ((fVar155 + fVar186) * fStack_10f0 - (fVar82 + fStack_1230) * fStack_10e0) * fVar49 +
             (fStack_10e0 * (fVar159 + fVar113) - (fVar155 + fVar186) * fStack_1100) * local_1118;
        auVar144._12_4_ =
             (fStack_10fc * (fVar83 + fStack_122c) - (fVar160 + fVar115) * fStack_10ec) * fVar161 +
             ((fVar156 + fVar187) * fStack_10ec - (fVar83 + fStack_122c) * fStack_10dc) * fVar49 +
             (fStack_10dc * (fVar160 + fVar115) - (fVar156 + fVar187) * fStack_10fc) * local_1118;
        fVar116 = fVar101 - fVar188;
        fVar129 = fVar112 - fVar191;
        fVar130 = fVar113 - fVar192;
        fVar131 = fVar115 - fVar193;
        local_f88 = (float)local_1238._0_4_ - fVar168;
        fStack_f84 = (float)local_1238._4_4_ - fVar174;
        fStack_f80 = fStack_1230 - fVar176;
        fStack_f7c = fStack_122c - fVar178;
        auVar148._0_4_ =
             (fVar116 * ((float)local_1238._0_4_ + fVar168) - (fVar101 + fVar188) * local_f88) *
             fVar161 + ((fVar180 + fVar204) * local_f88 -
                       ((float)local_1238._0_4_ + fVar168) * fVar162) * fVar49 +
                       (fVar162 * (fVar101 + fVar188) - (fVar180 + fVar204) * fVar116) * local_1118;
        auVar148._4_4_ =
             (fVar129 * ((float)local_1238._4_4_ + fVar174) - (fVar112 + fVar191) * fStack_f84) *
             fVar161 + ((fVar185 + fVar209) * fStack_f84 -
                       ((float)local_1238._4_4_ + fVar174) * fVar165) * fVar49 +
                       (fVar165 * (fVar112 + fVar191) - (fVar185 + fVar209) * fVar129) * local_1118;
        auVar148._8_4_ =
             (fVar130 * (fStack_1230 + fVar176) - (fVar113 + fVar192) * fStack_f80) * fVar161 +
             ((fVar186 + fVar212) * fStack_f80 - (fStack_1230 + fVar176) * fVar166) * fVar49 +
             (fVar166 * (fVar113 + fVar192) - (fVar186 + fVar212) * fVar130) * local_1118;
        auVar148._12_4_ =
             (fVar131 * (fStack_122c + fVar178) - (fVar115 + fVar193) * fStack_f7c) * fVar161 +
             ((fVar187 + fVar215) * fStack_f7c - (fStack_122c + fVar178) * fVar167) * fVar49 +
             (fVar167 * (fVar115 + fVar193) - (fVar187 + fVar215) * fVar131) * local_1118;
        fVar205 = fVar204 - fVar153;
        fVar210 = fVar209 - fVar154;
        fVar213 = fVar212 - fVar155;
        fVar216 = fVar215 - fVar156;
        fVar195 = fVar188 - fVar157;
        fVar198 = fVar191 - fVar158;
        fVar199 = fVar192 - fVar159;
        fVar200 = fVar193 - fVar160;
        fVar169 = fVar168 - fVar50;
        fVar175 = fVar174 - fVar81;
        fVar177 = fVar176 - fVar82;
        fVar179 = fVar178 - fVar83;
        fStack_1114 = local_1118;
        fStack_1110 = local_1118;
        fStack_110c = local_1118;
        auVar88._0_4_ =
             (fVar195 * (fVar50 + fVar168) - (fVar157 + fVar188) * fVar169) * fVar161 +
             ((fVar153 + fVar204) * fVar169 - (fVar50 + fVar168) * fVar205) * fVar49 +
             (fVar205 * (fVar157 + fVar188) - (fVar153 + fVar204) * fVar195) * local_1118;
        auVar88._4_4_ =
             (fVar198 * (fVar81 + fVar174) - (fVar158 + fVar191) * fVar175) * fVar161 +
             ((fVar154 + fVar209) * fVar175 - (fVar81 + fVar174) * fVar210) * fVar49 +
             (fVar210 * (fVar158 + fVar191) - (fVar154 + fVar209) * fVar198) * local_1118;
        auVar88._8_4_ =
             (fVar199 * (fVar82 + fVar176) - (fVar159 + fVar192) * fVar177) * fVar161 +
             ((fVar155 + fVar212) * fVar177 - (fVar82 + fVar176) * fVar213) * fVar49 +
             (fVar213 * (fVar159 + fVar192) - (fVar155 + fVar212) * fVar199) * local_1118;
        auVar88._12_4_ =
             (fVar200 * (fVar83 + fVar178) - (fVar160 + fVar193) * fVar179) * fVar161 +
             ((fVar156 + fVar215) * fVar179 - (fVar83 + fVar178) * fVar216) * fVar49 +
             (fVar216 * (fVar160 + fVar193) - (fVar156 + fVar215) * fVar200) * local_1118;
        auVar107._0_4_ = fVar141 + auVar148._0_4_ + auVar88._0_4_;
        auVar107._4_4_ = fVar147 + auVar148._4_4_ + auVar88._4_4_;
        auVar107._8_4_ = auVar144._8_4_ + auVar148._8_4_ + auVar88._8_4_;
        auVar107._12_4_ = auVar144._12_4_ + auVar148._12_4_ + auVar88._12_4_;
        auVar60._8_4_ = auVar144._8_4_;
        auVar60._0_8_ = auVar144._0_8_;
        auVar60._12_4_ = auVar144._12_4_;
        auVar61 = minps(auVar60,auVar148);
        auVar61 = minps(auVar61,auVar88);
        auVar134._8_4_ = auVar144._8_4_;
        auVar134._0_8_ = auVar144._0_8_;
        auVar134._12_4_ = auVar144._12_4_;
        auVar135 = maxps(auVar134,auVar148);
        auVar135 = maxps(auVar135,auVar88);
        local_fc8 = ABS(auVar107._0_4_);
        fStack_fc4 = ABS(auVar107._4_4_);
        fStack_fc0 = ABS(auVar107._8_4_);
        fStack_fbc = ABS(auVar107._12_4_);
        auVar136._4_4_ = -(uint)(auVar135._4_4_ <= fStack_fc4 * 1.1920929e-07);
        auVar136._0_4_ = -(uint)(auVar135._0_4_ <= local_fc8 * 1.1920929e-07);
        auVar136._8_4_ = -(uint)(auVar135._8_4_ <= fStack_fc0 * 1.1920929e-07);
        auVar136._12_4_ = -(uint)(auVar135._12_4_ <= fStack_fbc * 1.1920929e-07);
        auVar62._4_4_ = -(uint)(-(fStack_fc4 * 1.1920929e-07) <= auVar61._4_4_);
        auVar62._0_4_ = -(uint)(-(local_fc8 * 1.1920929e-07) <= auVar61._0_4_);
        auVar62._8_4_ = -(uint)(-(fStack_fc0 * 1.1920929e-07) <= auVar61._8_4_);
        auVar62._12_4_ = -(uint)(-(fStack_fbc * 1.1920929e-07) <= auVar61._12_4_);
        auVar136 = auVar136 | auVar62;
        iVar33 = movmskps((int)local_1250,auVar136);
        if (iVar33 != 0) {
          local_fa8 = auVar148;
          local_fb8 = fVar195;
          fStack_fb4 = fVar198;
          fStack_fb0 = fVar199;
          fStack_fac = fVar200;
          auVar26._4_4_ = fStack_f84;
          auVar26._0_4_ = local_f88;
          auVar26._8_4_ = fStack_f80;
          auVar26._12_4_ = fStack_f7c;
          local_f98 = auVar107;
          auVar149._0_4_ = fVar194 * local_f88 - fVar116 * local_10f8;
          auVar149._4_4_ = fVar197 * fStack_f84 - fVar129 * fStack_10f4;
          auVar149._8_4_ = fStack_1100 * fStack_f80 - fVar130 * fStack_10f0;
          auVar149._12_4_ = fStack_10fc * fStack_f7c - fVar131 * fStack_10ec;
          auVar189._0_4_ = fVar116 * fVar169 - fVar195 * local_f88;
          auVar189._4_4_ = fVar129 * fVar175 - fVar198 * fStack_f84;
          auVar189._8_4_ = fVar130 * fVar177 - fVar199 * fStack_f80;
          auVar189._12_4_ = fVar131 * fVar179 - fVar200 * fStack_f7c;
          auVar63._4_4_ = -(uint)(ABS(fVar129 * fStack_10f4) < ABS(fVar198 * fStack_f84));
          auVar63._0_4_ = -(uint)(ABS(fVar116 * local_10f8) < ABS(fVar195 * local_f88));
          auVar63._8_4_ = -(uint)(ABS(fVar130 * fStack_10f0) < ABS(fVar199 * fStack_f80));
          auVar63._12_4_ = -(uint)(ABS(fVar131 * fStack_10ec) < ABS(fVar200 * fStack_f7c));
          local_1148 = blendvps(auVar189,auVar149,auVar63);
          auVar181._0_4_ = local_10f8 * fVar162 - (float)local_10e8._0_4_ * local_f88;
          auVar181._4_4_ = fStack_10f4 * fVar165 - (float)local_10e8._4_4_ * fStack_f84;
          auVar181._8_4_ = fStack_10f0 * fVar166 - fStack_10e0 * fStack_f80;
          auVar181._12_4_ = fStack_10ec * fVar167 - fStack_10dc * fStack_f7c;
          auVar207._0_4_ = fVar205 * local_f88 - fVar162 * fVar169;
          auVar207._4_4_ = fVar210 * fStack_f84 - fVar165 * fVar175;
          auVar207._8_4_ = fVar213 * fStack_f80 - fVar166 * fVar177;
          auVar207._12_4_ = fVar216 * fStack_f7c - fVar167 * fVar179;
          auVar64._4_4_ =
               -(uint)(ABS((float)local_10e8._4_4_ * fStack_f84) < ABS(fVar165 * fVar175));
          auVar64._0_4_ = -(uint)(ABS((float)local_10e8._0_4_ * local_f88) < ABS(fVar162 * fVar169))
          ;
          auVar64._8_4_ = -(uint)(ABS(fStack_10e0 * fStack_f80) < ABS(fVar166 * fVar177));
          auVar64._12_4_ = -(uint)(ABS(fStack_10dc * fStack_f7c) < ABS(fVar167 * fVar179));
          local_1138 = blendvps(auVar207,auVar181,auVar64);
          auVar145._0_4_ = (float)local_10e8._0_4_ * fVar116 - fVar162 * fVar194;
          auVar145._4_4_ = (float)local_10e8._4_4_ * fVar129 - fVar165 * fVar197;
          auVar145._8_4_ = fStack_10e0 * fVar130 - fVar166 * fStack_1100;
          auVar145._12_4_ = fStack_10dc * fVar131 - fVar167 * fStack_10fc;
          auVar163._0_4_ = fVar162 * fVar195 - fVar205 * fVar116;
          auVar163._4_4_ = fVar165 * fVar198 - fVar210 * fVar129;
          auVar163._8_4_ = fVar166 * fVar199 - fVar213 * fVar130;
          auVar163._12_4_ = fVar167 * fVar200 - fVar216 * fVar131;
          auVar65._4_4_ = -(uint)(ABS(fVar165 * fVar197) < ABS(fVar210 * fVar129));
          auVar65._0_4_ = -(uint)(ABS(fVar162 * fVar194) < ABS(fVar205 * fVar116));
          auVar65._8_4_ = -(uint)(ABS(fVar166 * fStack_1100) < ABS(fVar213 * fVar130));
          auVar65._12_4_ = -(uint)(ABS(fVar167 * fStack_10fc) < ABS(fVar216 * fVar131));
          local_1128 = blendvps(auVar163,auVar145,auVar65);
          fVar130 = fVar161 * local_1148._0_4_ +
                    fVar49 * local_1138._0_4_ + local_1118 * local_1128._0_4_;
          fVar131 = fVar161 * local_1148._4_4_ +
                    fVar49 * local_1138._4_4_ + local_1118 * local_1128._4_4_;
          fVar155 = fVar161 * local_1148._8_4_ +
                    fVar49 * local_1138._8_4_ + local_1118 * local_1128._8_4_;
          fVar153 = fVar161 * local_1148._12_4_ +
                    fVar49 * local_1138._12_4_ + local_1118 * local_1128._12_4_;
          fVar130 = fVar130 + fVar130;
          fVar131 = fVar131 + fVar131;
          fVar155 = fVar155 + fVar155;
          fVar153 = fVar153 + fVar153;
          auVar66._0_4_ = fVar101 * local_1138._0_4_ + (float)local_1238._0_4_ * local_1128._0_4_;
          auVar66._4_4_ = fVar112 * local_1138._4_4_ + (float)local_1238._4_4_ * local_1128._4_4_;
          auVar66._8_4_ = fVar113 * local_1138._8_4_ + fStack_1230 * local_1128._8_4_;
          auVar66._12_4_ = fVar115 * local_1138._12_4_ + fStack_122c * local_1128._12_4_;
          fVar112 = fVar180 * local_1148._0_4_ + auVar66._0_4_;
          fVar115 = fVar185 * local_1148._4_4_ + auVar66._4_4_;
          fVar116 = fVar186 * local_1148._8_4_ + auVar66._8_4_;
          fVar129 = fVar187 * local_1148._12_4_ + auVar66._12_4_;
          auVar24._4_4_ = fVar131;
          auVar24._0_4_ = fVar130;
          auVar24._8_4_ = fVar155;
          auVar24._12_4_ = fVar153;
          auVar61 = rcpps(auVar66,auVar24);
          fVar49 = auVar61._0_4_;
          fVar50 = auVar61._4_4_;
          fVar81 = auVar61._8_4_;
          fVar82 = auVar61._12_4_;
          auVar170._0_4_ = ((1.0 - fVar130 * fVar49) * fVar49 + fVar49) * (fVar112 + fVar112);
          auVar170._4_4_ = ((1.0 - fVar131 * fVar50) * fVar50 + fVar50) * (fVar115 + fVar115);
          auVar170._8_4_ = ((1.0 - fVar155 * fVar81) * fVar81 + fVar81) * (fVar116 + fVar116);
          auVar170._12_4_ = ((1.0 - fVar153 * fVar82) * fVar82 + fVar82) * (fVar129 + fVar129);
          fVar50 = *(float *)(ray + k * 4 + 0x80);
          fVar49 = *(float *)(ray + k * 4 + 0x30);
          auVar67._0_4_ =
               -(uint)(auVar170._0_4_ <= fVar50 && fVar49 <= auVar170._0_4_) & auVar136._0_4_;
          auVar67._4_4_ =
               -(uint)(auVar170._4_4_ <= fVar50 && fVar49 <= auVar170._4_4_) & auVar136._4_4_;
          auVar67._8_4_ =
               -(uint)(auVar170._8_4_ <= fVar50 && fVar49 <= auVar170._8_4_) & auVar136._8_4_;
          auVar67._12_4_ =
               -(uint)(auVar170._12_4_ <= fVar50 && fVar49 <= auVar170._12_4_) & auVar136._12_4_;
          iVar33 = movmskps(iVar33,auVar67);
          if (iVar33 != 0) {
            valid.field_0.i[0] = auVar67._0_4_ & -(uint)(fVar130 != 0.0);
            valid.field_0.i[1] = auVar67._4_4_ & -(uint)(fVar131 != 0.0);
            valid.field_0.i[2] = auVar67._8_4_ & -(uint)(fVar155 != 0.0);
            valid.field_0.i[3] = auVar67._12_4_ & -(uint)(fVar153 != 0.0);
            iVar33 = movmskps(iVar33,(undefined1  [16])valid.field_0);
            if (iVar33 != 0) {
              uStack_12e0._0_4_ = *(float *)(pGVar17 + 0x18);
              uVar15 = *(undefined4 *)(pGVar17 + 0x1c);
              uStack_1300 = auVar144._8_8_;
              tNear.field_0._8_8_ = uStack_1300;
              tNear.field_0._0_8_ = auVar144._0_8_;
              local_1158 = auVar170;
              auVar40 = (undefined1  [8])
                        (context->scene->geometries).items[(uint)(float)uStack_12e0].ptr;
              if ((((Geometry *)auVar40)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar61 = *(undefined1 (*) [16])local_1250;
                auVar102 = auVar61._0_12_;
                auVar135 = *(undefined1 (*) [16])(local_1250 + uVar36 * 4);
                auVar85 = auVar135._0_12_;
                if (uVar36 == 2) {
                  auVar102._0_8_ = auVar61._0_8_;
                  auVar102._8_4_ = auVar61._4_4_;
                  auVar85._0_8_ = auVar135._0_8_;
                  auVar85._8_4_ = auVar135._4_4_;
                }
                auVar61 = rcpps(auVar26,auVar107);
                fVar49 = auVar61._0_4_;
                fVar81 = auVar61._4_4_;
                fVar82 = auVar61._8_4_;
                fVar112 = auVar61._12_4_;
                fVar49 = (float)(-(uint)(1e-18 <= local_fc8) &
                                (uint)(((float)DAT_01f7ba10 - auVar107._0_4_ * fVar49) * fVar49 +
                                      fVar49));
                fVar81 = (float)(-(uint)(1e-18 <= fStack_fc4) &
                                (uint)((DAT_01f7ba10._4_4_ - auVar107._4_4_ * fVar81) * fVar81 +
                                      fVar81));
                fVar82 = (float)(-(uint)(1e-18 <= fStack_fc0) &
                                (uint)((DAT_01f7ba10._8_4_ - auVar107._8_4_ * fVar82) * fVar82 +
                                      fVar82));
                fVar112 = (float)(-(uint)(1e-18 <= fStack_fbc) &
                                 (uint)((DAT_01f7ba10._12_4_ - auVar107._12_4_ * fVar112) * fVar112
                                       + fVar112));
                auVar182._0_4_ = fVar141 * fVar49;
                auVar182._4_4_ = fVar147 * fVar81;
                auVar182._8_4_ = auVar144._8_4_ * fVar82;
                auVar182._12_4_ = auVar144._12_4_ * fVar112;
                auVar183 = minps(auVar182,_DAT_01f7ba10);
                auVar150._0_4_ = auVar148._0_4_ * fVar49;
                auVar150._4_4_ = auVar148._4_4_ * fVar81;
                auVar150._8_4_ = auVar148._8_4_ * fVar82;
                auVar150._12_4_ = auVar148._12_4_ * fVar112;
                auVar117 = minps(auVar150,_DAT_01f7ba10);
                auVar108._4_4_ = auVar102._4_4_;
                auVar121._0_8_ = auVar102._0_8_;
                auVar108._8_4_ = auVar102._8_4_;
                auVar121._8_4_ = auVar108._4_4_;
                uVar100 = auVar85._4_4_;
                auVar121._12_4_ = uVar100;
                uVar84 = auVar85._0_4_;
                auVar120._8_8_ = auVar121._8_8_;
                auVar120._0_4_ = auVar102._0_4_;
                auVar120._4_4_ = uVar84;
                auVar108._0_4_ = auVar108._4_4_;
                auVar108._12_4_ = auVar108._8_4_;
                auVar89._0_8_ = auVar85._0_8_;
                auVar89._8_4_ = uVar100;
                auVar89._12_4_ = auVar85._8_4_;
                auVar104 = pblendw(auVar120,ZEXT816(0),0xaa);
                auVar135 = pblendw(auVar108,ZEXT816(0),0xaa);
                auVar61 = pblendw(auVar89,ZEXT816(0),0xaa);
                fVar131 = auVar183._0_4_;
                fVar101 = auVar183._4_4_;
                fVar141 = auVar183._8_4_;
                fVar147 = auVar183._12_4_;
                fVar115 = auVar117._0_4_;
                fVar116 = auVar117._4_4_;
                fVar129 = auVar117._8_4_;
                fVar130 = auVar117._12_4_;
                fVar49 = ((float)DAT_01f7ba10 - fVar131) - fVar115;
                fVar81 = (DAT_01f7ba10._4_4_ - fVar101) - fVar116;
                fVar82 = (DAT_01f7ba10._8_4_ - fVar141) - fVar129;
                fVar112 = (DAT_01f7ba10._12_4_ - fVar147) - fVar130;
                local_1178[0] =
                     (float)auVar104._0_4_ * 0.00012207031 * fVar49 +
                     (float)auVar61._0_4_ * 0.00012207031 * fVar115 +
                     (float)auVar135._0_4_ * 0.00012207031 * fVar131;
                local_1178[1] =
                     (float)auVar104._4_4_ * 0.00012207031 * fVar81 +
                     (float)auVar61._4_4_ * 0.00012207031 * fVar116 +
                     (float)auVar135._4_4_ * 0.00012207031 * fVar101;
                local_1178[2] =
                     (float)auVar104._8_4_ * 0.00012207031 * fVar82 +
                     (float)auVar61._8_4_ * 0.00012207031 * fVar129 +
                     (float)auVar135._8_4_ * 0.00012207031 * fVar141;
                local_1178[3] =
                     (float)auVar104._12_4_ * 0.00012207031 * fVar112 +
                     (float)auVar61._12_4_ * 0.00012207031 * fVar130 +
                     (float)auVar135._12_4_ * 0.00012207031 * fVar147;
                local_1168[0] =
                     fVar49 * (float)(auVar120._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar84 >> 0x10) * 0.00012207031 * fVar115 +
                     (float)(auVar108._4_4_ >> 0x10) * 0.00012207031 * fVar131;
                local_1168[1] =
                     fVar81 * (float)(uVar84 >> 0x10) * 0.00012207031 +
                     (float)(uVar100 >> 0x10) * 0.00012207031 * fVar116 +
                     (float)(auVar108._4_4_ >> 0x10) * 0.00012207031 * fVar101;
                local_1168[2] =
                     fVar82 * (float)(auVar108._4_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar100 >> 0x10) * 0.00012207031 * fVar129 +
                     (float)(auVar108._8_4_ >> 0x10) * 0.00012207031 * fVar141;
                local_1168[3] =
                     fVar112 * (float)(uVar100 >> 0x10) * 0.00012207031 +
                     (float)(auVar85._8_4_ >> 0x10) * 0.00012207031 * fVar130 +
                     (float)(auVar108._8_4_ >> 0x10) * 0.00012207031 * fVar147;
                auVar135 = blendvps(_DAT_01f7a9f0,auVar170,(undefined1  [16])valid.field_0);
                auVar122._4_4_ = auVar135._0_4_;
                auVar122._0_4_ = auVar135._4_4_;
                auVar122._8_4_ = auVar135._12_4_;
                auVar122._12_4_ = auVar135._8_4_;
                auVar61 = minps(auVar122,auVar135);
                auVar90._0_8_ = auVar61._8_8_;
                auVar90._8_4_ = auVar61._0_4_;
                auVar90._12_4_ = auVar61._4_4_;
                auVar61 = minps(auVar90,auVar61);
                uVar44 = -(uint)(auVar61._0_4_ == auVar135._0_4_);
                uVar46 = -(uint)(auVar61._4_4_ == auVar135._4_4_);
                uVar47 = -(uint)(auVar61._8_4_ == auVar135._8_4_);
                uVar48 = -(uint)(auVar61._12_4_ == auVar135._12_4_);
                auVar109._0_4_ = uVar44 & valid.field_0.i[0];
                auVar109._4_4_ = uVar46 & valid.field_0.i[1];
                auVar109._8_4_ = uVar47 & valid.field_0.i[2];
                auVar109._12_4_ = uVar48 & valid.field_0.i[3];
                iVar33 = movmskps((int)local_1250,auVar109);
                uVar84 = 0xffffffff;
                uVar100 = 0xffffffff;
                uVar114 = 0xffffffff;
                uVar45 = 0xffffffff;
                if (iVar33 != 0) {
                  uVar84 = uVar44;
                  uVar100 = uVar46;
                  uVar114 = uVar47;
                  uVar45 = uVar48;
                }
                auVar68._0_4_ = valid.field_0.i[0] & uVar84;
                auVar68._4_4_ = valid.field_0.i[1] & uVar100;
                auVar68._8_4_ = valid.field_0.i[2] & uVar114;
                auVar68._12_4_ = valid.field_0.i[3] & uVar45;
                uVar35 = movmskps(iVar33,auVar68);
                uVar34 = CONCAT44((int)((ulong)local_1250 >> 0x20),uVar35);
                lVar39 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (((Geometry *)auVar40)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar49 = local_1178[lVar39];
                  fVar50 = local_1168[lVar39];
                  uVar35 = *(undefined4 *)(local_1148 + lVar39 * 4);
                  uVar13 = *(undefined4 *)(local_1138 + lVar39 * 4);
                  uVar14 = *(undefined4 *)(local_1128 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar35;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                  *(float *)(ray + k * 4 + 0xf0) = fVar49;
                  *(float *)(ray + k * 4 + 0x100) = fVar50;
                  *(undefined4 *)(ray + k * 4 + 0x110) = uVar15;
                  *(float *)(ray + k * 4 + 0x120) = (float)uStack_12e0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_12e8 = CONCAT44((float)uStack_12e0,(float)uStack_12e0);
                  uStack_12e0._4_4_ = (float)uStack_12e0;
                  local_1288 = CONCAT44(uVar15,uVar15);
                  auVar102 = *(undefined1 (*) [12])*(undefined1 (*) [16])(mm_lookupmask_ps + lVar29)
                  ;
                  fStack_128c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar29 + 8) >>
                                       0x20);
                  local_1238 = auVar40;
                  local_1248 = uVar36;
                  _local_1228 = auVar170;
                  while( true ) {
                    local_1098 = local_1178[lVar39];
                    fVar49 = local_1168[lVar39];
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar39 * 4);
                    args.context = context->user;
                    local_1088._4_4_ = fVar49;
                    local_1088._0_4_ = fVar49;
                    local_1088._8_4_ = fVar49;
                    local_1088._12_4_ = fVar49;
                    local_10c8 = *(undefined4 *)(local_1148 + lVar39 * 4);
                    uVar35 = *(undefined4 *)(local_1138 + lVar39 * 4);
                    uVar13 = *(undefined4 *)(local_1128 + lVar39 * 4);
                    local_10b8._4_4_ = uVar35;
                    local_10b8._0_4_ = uVar35;
                    local_10b8._8_4_ = uVar35;
                    local_10b8._12_4_ = uVar35;
                    local_10a8._4_4_ = uVar13;
                    local_10a8._0_4_ = uVar13;
                    local_10a8._8_4_ = uVar13;
                    local_10a8._12_4_ = uVar13;
                    uStack_10c4 = local_10c8;
                    uStack_10c0 = local_10c8;
                    uStack_10bc = local_10c8;
                    fStack_1094 = local_1098;
                    fStack_1090 = local_1098;
                    fStack_108c = local_1098;
                    local_1078 = local_1288;
                    uStack_1070 = CONCAT44(uVar15,uVar15);
                    local_1068 = local_12e8;
                    uStack_1060 = uStack_12e0;
                    local_1058 = (args.context)->instID[0];
                    uStack_1054 = local_1058;
                    uStack_1050 = local_1058;
                    uStack_104c = local_1058;
                    local_1048 = (args.context)->instPrimID[0];
                    uStack_1044 = local_1048;
                    uStack_1040 = local_1048;
                    uStack_103c = local_1048;
                    local_1268._12_4_ = fStack_128c;
                    local_1268._0_12_ = auVar102;
                    args.valid = (int *)local_1268;
                    args.geometryUserPtr = ((Geometry *)auVar40)->userPtr;
                    args.hit = (RTCHitN *)&local_10c8;
                    args.N = 4;
                    pRVar31 = (RTCRayN *)((Geometry *)auVar40)->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar31 != (RTCRayN *)0x0) {
                      pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                      auVar40 = local_1238;
                      auVar170 = _local_1228;
                    }
                    if (local_1268 == (undefined1  [16])0x0) {
                      auVar94._8_4_ = 0xffffffff;
                      auVar94._0_8_ = 0xffffffffffffffff;
                      auVar94._12_4_ = 0xffffffff;
                      auVar94 = auVar94 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar31 = (RTCRayN *)context->args->filter;
                      if ((pRVar31 != (RTCRayN *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((((Geometry *)auVar40)->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                        auVar40 = local_1238;
                        auVar170 = _local_1228;
                      }
                      auVar77._0_4_ = -(uint)(local_1268._0_4_ == 0);
                      auVar77._4_4_ = -(uint)(local_1268._4_4_ == 0);
                      auVar77._8_4_ = -(uint)(local_1268._8_4_ == 0);
                      auVar77._12_4_ = -(uint)(local_1268._12_4_ == 0);
                      auVar94 = auVar77 ^ _DAT_01f7ae20;
                      if (local_1268 != (undefined1  [16])0x0) {
                        auVar61 = blendvps(*(undefined1 (*) [16])args.hit,
                                           *(undefined1 (*) [16])(args.ray + 0xc0),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                           *(undefined1 (*) [16])(args.ray + 0xd0),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                           *(undefined1 (*) [16])(args.ray + 0xe0),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                           *(undefined1 (*) [16])(args.ray + 0xf0),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                           *(undefined1 (*) [16])(args.ray + 0x100),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                           *(undefined1 (*) [16])(args.ray + 0x110),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                           *(undefined1 (*) [16])(args.ray + 0x120),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                           *(undefined1 (*) [16])(args.ray + 0x130),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar61;
                        auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                           *(undefined1 (*) [16])(args.ray + 0x140),auVar77);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar61;
                        pRVar31 = args.ray;
                      }
                    }
                    if ((_DAT_01f7bb20 & auVar94) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar50;
                    }
                    else {
                      fVar50 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1268 + lVar39 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(auVar170._0_4_ <= fVar50) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(auVar170._4_4_ <= fVar50) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(auVar170._8_4_ <= fVar50) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(auVar170._12_4_ <= fVar50) & valid.field_0.i[3];
                    iVar33 = movmskps((int)pRVar31,(undefined1  [16])valid.field_0);
                    if (iVar33 == 0) break;
                    auVar135 = blendvps(_DAT_01f7a9f0,auVar170,(undefined1  [16])valid.field_0);
                    auVar127._4_4_ = auVar135._0_4_;
                    auVar127._0_4_ = auVar135._4_4_;
                    auVar127._8_4_ = auVar135._12_4_;
                    auVar127._12_4_ = auVar135._8_4_;
                    auVar61 = minps(auVar127,auVar135);
                    auVar95._0_8_ = auVar61._8_8_;
                    auVar95._8_4_ = auVar61._0_4_;
                    auVar95._12_4_ = auVar61._4_4_;
                    auVar61 = minps(auVar95,auVar61);
                    auVar96._0_8_ =
                         CONCAT44(-(uint)(auVar61._4_4_ == auVar135._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar61._0_4_ == auVar135._0_4_) & valid.field_0.i[0]);
                    auVar96._8_4_ = -(uint)(auVar61._8_4_ == auVar135._8_4_) & valid.field_0.i[2];
                    auVar96._12_4_ = -(uint)(auVar61._12_4_ == auVar135._12_4_) & valid.field_0.i[3]
                    ;
                    iVar33 = movmskps(iVar33,auVar96);
                    aVar78 = valid.field_0;
                    if (iVar33 != 0) {
                      aVar78.i[2] = auVar96._8_4_;
                      aVar78._0_8_ = auVar96._0_8_;
                      aVar78.i[3] = auVar96._12_4_;
                    }
                    uVar35 = movmskps(iVar33,(undefined1  [16])aVar78);
                    uVar34 = CONCAT44((int)((ulong)pRVar31 >> 0x20),uVar35);
                    lVar39 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (2 < uVar32) {
          lVar28 = uVar36 * 4 + lVar28;
          pGVar41 = pGVar17 + lVar28 + 0x2c;
          local_1108 = (local_1258->super_Precalculations).grid;
          uVar34 = (ulong)*(uint *)(local_1108 + 0x14);
          pGVar11 = pGVar41 + uVar34 * 4;
          pGVar9 = pGVar41 + uVar34 * 8;
          fVar49 = *(float *)(pGVar17 + lVar28 + 0x30);
          pGVar10 = pGVar41 + uVar36 * 4;
          fVar50 = *(float *)(pGVar10 + 4);
          if (uVar36 == 2) {
            uStack_12c0._0_4_ = fVar50;
            local_12c8 = *(undefined8 *)pGVar10;
            uStack_12c0._4_4_ = fVar50;
            fVar81 = *(float *)pGVar11;
            fVar82 = *(float *)(pGVar11 + 4);
            fVar112 = *(float *)(pGVar11 + 8);
            fVar115 = *(float *)(pGVar11 + 0xc);
            local_1308._4_4_ = fVar82;
            local_1308._0_4_ = fVar82;
            uStack_1300._0_4_ = fVar82;
            uStack_1300._4_4_ = fVar82;
            local_12d8 = *(float *)pGVar9;
            fVar116 = *(float *)(pGVar9 + 4);
            fVar129 = *(float *)(pGVar9 + 8);
            fVar130 = *(float *)(pGVar9 + 0xc);
            uVar37 = (ulong)((*(uint *)(local_1108 + 0x28) >> 2) << 2);
            fVar131 = *(float *)(pGVar41 + uVar37);
            fVar101 = *(float *)(pGVar41 + uVar37 + 4);
            fVar141 = *(float *)(pGVar41 + uVar37 + 8);
            fVar147 = *(float *)(pGVar41 + uVar37 + 0xc);
            fVar155 = *(float *)(pGVar11 + uVar37);
            fVar113 = *(float *)(pGVar11 + uVar37 + 4);
            fVar153 = *(float *)(pGVar11 + uVar37 + 8);
            fVar157 = *(float *)(pGVar11 + uVar37 + 0xc);
            fVar159 = *(float *)(pGVar9 + uVar37);
            fVar154 = *(float *)(pGVar9 + uVar37 + 4);
            fVar158 = *(float *)(pGVar9 + uVar37 + 8);
            fVar162 = *(float *)(pGVar9 + uVar37 + 0xc);
            fVar165 = fVar154;
            fVar166 = fVar115;
            fVar167 = fVar130;
            fVar168 = fVar147;
            fVar169 = fVar157;
            fVar175 = fVar162;
            fVar177 = fVar116;
            fVar174 = fVar101;
            fVar156 = fVar49;
            fVar160 = fVar113;
          }
          else {
            uStack_12c0._0_4_ = fVar50;
            local_12c8 = *(undefined8 *)pGVar10;
            uStack_12c0._4_4_ = *(float *)(pGVar10 + 8);
            fVar81 = *(float *)pGVar11;
            fVar82 = *(float *)(pGVar11 + 4);
            pGVar1 = pGVar11 + uVar36 * 4;
            fVar112 = *(float *)pGVar1;
            fVar115 = *(float *)(pGVar1 + 8);
            local_1308._4_4_ = fVar82;
            local_1308._0_4_ = fVar82;
            uStack_1300._0_4_ = (float)*(undefined4 *)(pGVar11 + 8);
            uStack_1300._4_4_ = (float)*(undefined4 *)(pGVar11 + 8);
            local_12d8 = *(float *)pGVar9;
            fVar116 = *(float *)(pGVar9 + 4);
            pGVar2 = pGVar9 + uVar36 * 4;
            fVar129 = *(float *)pGVar2;
            fVar130 = *(float *)(pGVar2 + 4);
            uVar37 = (ulong)((*(uint *)(local_1108 + 0x28) >> 2) << 2);
            pGVar3 = pGVar41 + uVar37;
            fVar131 = *(float *)pGVar3;
            fVar101 = *(float *)(pGVar3 + 4);
            pGVar4 = pGVar41 + uVar36 * 4 + uVar37;
            fVar141 = *(float *)pGVar4;
            fVar147 = *(float *)(pGVar4 + 4);
            pGVar5 = pGVar11 + uVar37;
            fVar155 = *(float *)pGVar5;
            fVar113 = *(float *)(pGVar5 + 4);
            pGVar11 = pGVar11 + uVar36 * 4 + uVar37;
            fVar153 = *(float *)pGVar11;
            fVar157 = *(float *)(pGVar11 + 4);
            pGVar6 = pGVar9 + uVar37;
            fVar159 = *(float *)pGVar6;
            fVar154 = *(float *)(pGVar6 + 4);
            pGVar7 = pGVar9 + uVar36 * 4 + uVar37;
            fVar158 = *(float *)pGVar7;
            fVar162 = *(float *)(pGVar7 + 4);
            fVar165 = *(float *)(pGVar6 + 8);
            fVar166 = *(float *)(pGVar1 + 4);
            fVar167 = *(float *)(pGVar2 + 8);
            fVar168 = *(float *)(pGVar4 + 8);
            fVar169 = *(float *)(pGVar11 + 8);
            fVar175 = *(float *)(pGVar7 + 8);
            fVar177 = *(float *)(pGVar9 + 8);
            fVar174 = *(float *)(pGVar3 + 8);
            fVar156 = *(float *)(pGVar17 + lVar28 + 0x34);
            fVar160 = *(float *)(pGVar5 + 8);
          }
          local_1250 = pGVar41 + uVar34 * 0xc;
          local_1240 = (ulong)uVar32;
          fVar83 = *(float *)(ray + k * 4);
          fVar161 = *(float *)(ray + k * 4 + 0x10);
          fVar176 = *(float *)(ray + k * 4 + 0x20);
          fVar178 = *(float *)(ray + k * 4 + 0x40);
          fVar179 = *(float *)(ray + k * 4 + 0x50);
          fVar131 = (*(float *)pGVar41 * local_10d8 + fVar131 * fVar203) - fVar83;
          fVar180 = (*(float *)pGVar10 * fStack_10d4 + fVar141 * fVar203) - fVar83;
          fVar185 = (fVar49 * fStack_10d0 + fVar101 * fVar203) - fVar83;
          fVar50 = (fVar50 * fStack_10cc + fVar147 * fVar203) - fVar83;
          fVar81 = (fVar81 * local_10d8 + fVar155 * fVar203) - fVar161;
          fVar155 = (fVar112 * fStack_10d4 + fVar153 * fVar203) - fVar161;
          fVar82 = (fVar82 * fStack_10d0 + fVar113 * fVar203) - fVar161;
          fVar186 = (fVar166 * fStack_10cc + fVar157 * fVar203) - fVar161;
          fVar199 = (local_12d8 * local_10d8 + fVar159 * fVar203) - fVar176;
          fVar200 = (fVar129 * fStack_10d4 + fVar158 * fVar203) - fVar176;
          fVar204 = (fVar116 * fStack_10d0 + fVar154 * fVar203) - fVar176;
          fVar205 = (fVar130 * fStack_10cc + fVar162 * fVar203) - fVar176;
          fVar188 = (fVar49 * local_10d8 + fVar101 * fVar203) - fVar83;
          fVar192 = (fVar49 * fStack_10d4 + fVar101 * fVar203) - fVar83;
          fVar194 = (fVar156 * fStack_10d0 + fVar174 * fVar203) - fVar83;
          fVar197 = (fVar156 * fStack_10cc + fVar174 * fVar203) - fVar83;
          fVar159 = ((float)local_1308 * local_10d8 + fVar113 * fVar203) - fVar161;
          fVar113 = (local_1308._4_4_ * fStack_10d4 + fVar113 * fVar203) - fVar161;
          fVar174 = ((float)uStack_1300 * fStack_10d0 + fVar160 * fVar203) - fVar161;
          fVar156 = (uStack_1300._4_4_ * fStack_10cc + fVar160 * fVar203) - fVar161;
          fVar160 = (fVar116 * local_10d8 + fVar154 * fVar203) - fVar176;
          fVar154 = (fVar116 * fStack_10d4 + fVar154 * fVar203) - fVar176;
          fVar187 = (fVar177 * fStack_10d0 + fVar165 * fVar203) - fVar176;
          fVar165 = (fVar177 * fStack_10cc + fVar165 * fVar203) - fVar176;
          fVar141 = ((float)local_12c8 * local_10d8 + fVar141 * fVar203) - fVar83;
          fVar177 = (local_12c8._4_4_ * fStack_10d4 + fVar147 * fVar203) - fVar83;
          fVar147 = ((float)uStack_12c0 * fStack_10d0 + fVar147 * fVar203) - fVar83;
          fVar83 = (uStack_12c0._4_4_ * fStack_10cc + fVar168 * fVar203) - fVar83;
          fVar153 = (fVar112 * local_10d8 + fVar153 * fVar203) - fVar161;
          fVar168 = (fVar166 * fStack_10d4 + fVar157 * fVar203) - fVar161;
          fVar157 = (fVar166 * fStack_10d0 + fVar157 * fVar203) - fVar161;
          fVar161 = (fVar115 * fStack_10cc + fVar169 * fVar203) - fVar161;
          fVar112 = (fVar129 * local_10d8 + fVar158 * fVar203) - fVar176;
          fVar115 = (fVar130 * fStack_10d4 + fVar162 * fVar203) - fVar176;
          fVar116 = (fVar130 * fStack_10d0 + fVar162 * fVar203) - fVar176;
          fVar176 = (fVar167 * fStack_10cc + fVar175 * fVar203) - fVar176;
          fVar209 = fVar141 - fVar131;
          fVar212 = fVar177 - fVar180;
          fVar215 = fVar147 - fVar185;
          fVar201 = fVar83 - fVar50;
          local_10d8 = fVar153 - fVar81;
          fStack_10d4 = fVar168 - fVar155;
          fStack_10d0 = fVar157 - fVar82;
          fStack_10cc = fVar161 - fVar186;
          fVar206 = fVar112 - fVar199;
          fVar211 = fVar115 - fVar200;
          fVar214 = fVar116 - fVar204;
          fVar217 = fVar176 - fVar205;
          fVar49 = *(float *)(ray + k * 4 + 0x60);
          fVar210 = fVar131 - fVar188;
          fVar213 = fVar180 - fVar192;
          fVar216 = fVar185 - fVar194;
          fVar202 = fVar50 - fVar197;
          fVar191 = fVar81 - fVar159;
          fVar193 = fVar155 - fVar113;
          fVar195 = fVar82 - fVar174;
          fVar198 = fVar186 - fVar156;
          fVar169 = (local_10d8 * (fVar112 + fVar199) - (fVar153 + fVar81) * fVar206) * fVar178 +
                    ((fVar141 + fVar131) * fVar206 - (fVar112 + fVar199) * fVar209) * fVar179 +
                    (fVar209 * (fVar153 + fVar81) - (fVar141 + fVar131) * local_10d8) * fVar49;
          fVar175 = (fStack_10d4 * (fVar115 + fVar200) - (fVar168 + fVar155) * fVar211) * fVar178 +
                    ((fVar177 + fVar180) * fVar211 - (fVar115 + fVar200) * fVar212) * fVar179 +
                    (fVar212 * (fVar168 + fVar155) - (fVar177 + fVar180) * fStack_10d4) * fVar49;
          auVar171._0_8_ = CONCAT44(fVar175,fVar169);
          auVar171._8_4_ =
               (fStack_10d0 * (fVar116 + fVar204) - (fVar157 + fVar82) * fVar214) * fVar178 +
               ((fVar147 + fVar185) * fVar214 - (fVar116 + fVar204) * fVar215) * fVar179 +
               (fVar215 * (fVar157 + fVar82) - (fVar147 + fVar185) * fStack_10d0) * fVar49;
          auVar171._12_4_ =
               (fStack_10cc * (fVar176 + fVar205) - (fVar161 + fVar186) * fVar217) * fVar178 +
               ((fVar83 + fVar50) * fVar217 - (fVar176 + fVar205) * fVar201) * fVar179 +
               (fVar201 * (fVar161 + fVar186) - (fVar83 + fVar50) * fStack_10cc) * fVar49;
          local_1228._0_4_ = fVar199 - fVar160;
          local_1228._4_4_ = fVar200 - fVar154;
          fStack_1220 = fVar204 - fVar187;
          fStack_121c = fVar205 - fVar165;
          local_10e8._0_4_ =
               (fVar191 * (fVar199 + fVar160) - (fVar81 + fVar159) * (float)local_1228._0_4_) *
               fVar178 + ((fVar131 + fVar188) * (float)local_1228._0_4_ -
                         (fVar199 + fVar160) * fVar210) * fVar179 +
                         (fVar210 * (fVar81 + fVar159) - (fVar131 + fVar188) * fVar191) * fVar49;
          local_10e8._4_4_ =
               (fVar193 * (fVar200 + fVar154) - (fVar155 + fVar113) * (float)local_1228._4_4_) *
               fVar178 + ((fVar180 + fVar192) * (float)local_1228._4_4_ -
                         (fVar200 + fVar154) * fVar213) * fVar179 +
                         (fVar213 * (fVar155 + fVar113) - (fVar180 + fVar192) * fVar193) * fVar49;
          fStack_10e0 = (fVar195 * (fVar204 + fVar187) - (fVar82 + fVar174) * fStack_1220) * fVar178
                        + ((fVar185 + fVar194) * fStack_1220 - (fVar204 + fVar187) * fVar216) *
                          fVar179 + (fVar216 * (fVar82 + fVar174) - (fVar185 + fVar194) * fVar195) *
                                    fVar49;
          fStack_10dc = (fVar198 * (fVar205 + fVar165) - (fVar186 + fVar156) * fStack_121c) *
                        fVar178 + ((fVar50 + fVar197) * fStack_121c - (fVar205 + fVar165) * fVar202)
                                  * fVar179 +
                                  (fVar202 * (fVar186 + fVar156) - (fVar50 + fVar197) * fVar198) *
                                  fVar49;
          fVar158 = fVar188 - fVar141;
          fVar162 = fVar192 - fVar177;
          fVar166 = fVar194 - fVar147;
          fVar167 = fVar197 - fVar83;
          local_10f8 = fVar159 - fVar153;
          fStack_10f4 = fVar113 - fVar168;
          fStack_10f0 = fVar174 - fVar157;
          fStack_10ec = fVar156 - fVar161;
          fVar203 = fVar160 - fVar112;
          fVar129 = fVar154 - fVar115;
          fVar130 = fVar187 - fVar116;
          fVar101 = fVar165 - fVar176;
          auVar91._0_4_ =
               (local_10f8 * (fVar112 + fVar160) - (fVar153 + fVar159) * fVar203) * fVar178 +
               ((fVar141 + fVar188) * fVar203 - (fVar112 + fVar160) * fVar158) * fVar179 +
               (fVar158 * (fVar153 + fVar159) - (fVar141 + fVar188) * local_10f8) * fVar49;
          auVar91._4_4_ =
               (fStack_10f4 * (fVar115 + fVar154) - (fVar168 + fVar113) * fVar129) * fVar178 +
               ((fVar177 + fVar192) * fVar129 - (fVar115 + fVar154) * fVar162) * fVar179 +
               (fVar162 * (fVar168 + fVar113) - (fVar177 + fVar192) * fStack_10f4) * fVar49;
          auVar91._8_4_ =
               (fStack_10f0 * (fVar116 + fVar187) - (fVar157 + fVar174) * fVar130) * fVar178 +
               ((fVar147 + fVar194) * fVar130 - (fVar116 + fVar187) * fVar166) * fVar179 +
               (fVar166 * (fVar157 + fVar174) - (fVar147 + fVar194) * fStack_10f0) * fVar49;
          auVar91._12_4_ =
               (fStack_10ec * (fVar176 + fVar165) - (fVar161 + fVar156) * fVar101) * fVar178 +
               ((fVar83 + fVar197) * fVar101 - (fVar176 + fVar165) * fVar167) * fVar179 +
               (fVar167 * (fVar161 + fVar156) - (fVar83 + fVar197) * fStack_10ec) * fVar49;
          local_1238._0_4_ = fVar169 + (float)local_10e8._0_4_ + auVar91._0_4_;
          local_1238._4_4_ = fVar175 + (float)local_10e8._4_4_ + auVar91._4_4_;
          fStack_1230 = auVar171._8_4_ + fStack_10e0 + auVar91._8_4_;
          fStack_122c = auVar171._12_4_ + fStack_10dc + auVar91._12_4_;
          auVar69._8_4_ = auVar171._8_4_;
          auVar69._0_8_ = auVar171._0_8_;
          auVar69._12_4_ = auVar171._12_4_;
          auVar61 = minps(auVar69,_local_10e8);
          auVar61 = minps(auVar61,auVar91);
          auVar135 = maxps(auVar171,_local_10e8);
          auVar135 = maxps(auVar135,auVar91);
          local_1118 = ABS((float)local_1238._0_4_);
          fStack_1114 = ABS((float)local_1238._4_4_);
          fStack_1110 = ABS(fStack_1230);
          fStack_110c = ABS(fStack_122c);
          auVar172._4_4_ = -(uint)(auVar135._4_4_ <= fStack_1114 * 1.1920929e-07);
          auVar172._0_4_ = -(uint)(auVar135._0_4_ <= local_1118 * 1.1920929e-07);
          auVar172._8_4_ = -(uint)(auVar135._8_4_ <= fStack_1110 * 1.1920929e-07);
          auVar172._12_4_ = -(uint)(auVar135._12_4_ <= fStack_110c * 1.1920929e-07);
          auVar70._4_4_ = -(uint)(-(fStack_1114 * 1.1920929e-07) <= auVar61._4_4_);
          auVar70._0_4_ = -(uint)(-(local_1118 * 1.1920929e-07) <= auVar61._0_4_);
          auVar70._8_4_ = -(uint)(-(fStack_1110 * 1.1920929e-07) <= auVar61._8_4_);
          auVar70._12_4_ = -(uint)(-(fStack_110c * 1.1920929e-07) <= auVar61._12_4_);
          auVar172 = auVar172 | auVar70;
          iVar33 = movmskps((int)local_1250,auVar172);
          if (iVar33 != 0) {
            auVar151._0_4_ = local_10d8 * (float)local_1228._0_4_ - fVar191 * fVar206;
            auVar151._4_4_ = fStack_10d4 * (float)local_1228._4_4_ - fVar193 * fVar211;
            auVar151._8_4_ = fStack_10d0 * fStack_1220 - fVar195 * fVar214;
            auVar151._12_4_ = fStack_10cc * fStack_121c - fVar198 * fVar217;
            auVar184._0_4_ = fVar191 * fVar203 - local_10f8 * (float)local_1228._0_4_;
            auVar184._4_4_ = fVar193 * fVar129 - fStack_10f4 * (float)local_1228._4_4_;
            auVar184._8_4_ = fVar195 * fVar130 - fStack_10f0 * fStack_1220;
            auVar184._12_4_ = fVar198 * fVar101 - fStack_10ec * fStack_121c;
            auVar71._4_4_ =
                 -(uint)(ABS(fVar193 * fVar211) < ABS(fStack_10f4 * (float)local_1228._4_4_));
            auVar71._0_4_ =
                 -(uint)(ABS(fVar191 * fVar206) < ABS(local_10f8 * (float)local_1228._0_4_));
            auVar71._8_4_ = -(uint)(ABS(fVar195 * fVar214) < ABS(fStack_10f0 * fStack_1220));
            auVar71._12_4_ = -(uint)(ABS(fVar198 * fVar217) < ABS(fStack_10ec * fStack_121c));
            local_1148 = blendvps(auVar184,auVar151,auVar71);
            auVar146._0_4_ = fVar206 * fVar210 - fVar209 * (float)local_1228._0_4_;
            auVar146._4_4_ = fVar211 * fVar213 - fVar212 * (float)local_1228._4_4_;
            auVar146._8_4_ = fVar214 * fVar216 - fVar215 * fStack_1220;
            auVar146._12_4_ = fVar217 * fVar202 - fVar201 * fStack_121c;
            auVar164._0_4_ = fVar158 * (float)local_1228._0_4_ - fVar210 * fVar203;
            auVar164._4_4_ = fVar162 * (float)local_1228._4_4_ - fVar213 * fVar129;
            auVar164._8_4_ = fVar166 * fStack_1220 - fVar216 * fVar130;
            auVar164._12_4_ = fVar167 * fStack_121c - fVar202 * fVar101;
            auVar72._4_4_ = -(uint)(ABS(fVar212 * (float)local_1228._4_4_) < ABS(fVar213 * fVar129))
            ;
            auVar72._0_4_ = -(uint)(ABS(fVar209 * (float)local_1228._0_4_) < ABS(fVar210 * fVar203))
            ;
            auVar72._8_4_ = -(uint)(ABS(fVar215 * fStack_1220) < ABS(fVar216 * fVar130));
            auVar72._12_4_ = -(uint)(ABS(fVar201 * fStack_121c) < ABS(fVar202 * fVar101));
            local_1138 = blendvps(auVar164,auVar146,auVar72);
            auVar196._0_4_ = fVar210 * local_10f8 - fVar158 * fVar191;
            auVar196._4_4_ = fVar213 * fStack_10f4 - fVar162 * fVar193;
            auVar196._8_4_ = fVar216 * fStack_10f0 - fVar166 * fVar195;
            auVar196._12_4_ = fVar202 * fStack_10ec - fVar167 * fVar198;
            auVar73._4_4_ = -(uint)(ABS(fVar213 * fStack_10d4) < ABS(fVar162 * fVar193));
            auVar73._0_4_ = -(uint)(ABS(fVar210 * local_10d8) < ABS(fVar158 * fVar191));
            auVar73._8_4_ = -(uint)(ABS(fVar216 * fStack_10d0) < ABS(fVar166 * fVar195));
            auVar73._12_4_ = -(uint)(ABS(fVar202 * fStack_10cc) < ABS(fVar167 * fVar198));
            auVar25._4_4_ = fVar212 * fVar193 - fVar213 * fStack_10d4;
            auVar25._0_4_ = fVar209 * fVar191 - fVar210 * local_10d8;
            auVar25._8_4_ = fVar215 * fVar195 - fVar216 * fStack_10d0;
            auVar25._12_4_ = fVar201 * fVar198 - fVar202 * fStack_10cc;
            local_1128 = blendvps(auVar196,auVar25,auVar73);
            fVar203 = fVar178 * local_1148._0_4_ +
                      fVar179 * local_1138._0_4_ + fVar49 * local_1128._0_4_;
            fVar112 = fVar178 * local_1148._4_4_ +
                      fVar179 * local_1138._4_4_ + fVar49 * local_1128._4_4_;
            fVar115 = fVar178 * local_1148._8_4_ +
                      fVar179 * local_1138._8_4_ + fVar49 * local_1128._8_4_;
            fVar49 = fVar178 * local_1148._12_4_ +
                     fVar179 * local_1138._12_4_ + fVar49 * local_1128._12_4_;
            auVar208._0_4_ = fVar203 + fVar203;
            auVar208._4_4_ = fVar112 + fVar112;
            auVar208._8_4_ = fVar115 + fVar115;
            auVar208._12_4_ = fVar49 + fVar49;
            auVar74._0_4_ = fVar81 * local_1138._0_4_ + fVar199 * local_1128._0_4_;
            auVar74._4_4_ = fVar155 * local_1138._4_4_ + fVar200 * local_1128._4_4_;
            auVar74._8_4_ = fVar82 * local_1138._8_4_ + fVar204 * local_1128._8_4_;
            auVar74._12_4_ = fVar186 * local_1138._12_4_ + fVar205 * local_1128._12_4_;
            fVar49 = fVar131 * local_1148._0_4_ + auVar74._0_4_;
            fVar203 = fVar180 * local_1148._4_4_ + auVar74._4_4_;
            fVar81 = fVar185 * local_1148._8_4_ + auVar74._8_4_;
            fVar50 = fVar50 * local_1148._12_4_ + auVar74._12_4_;
            auVar123._0_4_ = fVar49 + fVar49;
            auVar123._4_4_ = fVar203 + fVar203;
            auVar123._8_4_ = fVar81 + fVar81;
            auVar123._12_4_ = fVar50 + fVar50;
            auVar61 = rcpps(auVar74,auVar208);
            fVar49 = auVar61._0_4_;
            fVar203 = auVar61._4_4_;
            fVar50 = auVar61._8_4_;
            fVar81 = auVar61._12_4_;
            auVar190._0_4_ = ((1.0 - auVar208._0_4_ * fVar49) * fVar49 + fVar49) * auVar123._0_4_;
            auVar190._4_4_ = ((1.0 - auVar208._4_4_ * fVar203) * fVar203 + fVar203) * auVar123._4_4_
            ;
            auVar190._8_4_ = ((1.0 - auVar208._8_4_ * fVar50) * fVar50 + fVar50) * auVar123._8_4_;
            auVar190._12_4_ = ((1.0 - auVar208._12_4_ * fVar81) * fVar81 + fVar81) * auVar123._12_4_
            ;
            fVar49 = *(float *)(ray + k * 4 + 0x80);
            fVar203 = *(float *)(ray + k * 4 + 0x30);
            auVar75._0_4_ =
                 -(uint)(auVar190._0_4_ <= fVar49 && fVar203 <= auVar190._0_4_) & auVar172._0_4_;
            auVar75._4_4_ =
                 -(uint)(auVar190._4_4_ <= fVar49 && fVar203 <= auVar190._4_4_) & auVar172._4_4_;
            auVar75._8_4_ =
                 -(uint)(auVar190._8_4_ <= fVar49 && fVar203 <= auVar190._8_4_) & auVar172._8_4_;
            auVar75._12_4_ =
                 -(uint)(auVar190._12_4_ <= fVar49 && fVar203 <= auVar190._12_4_) & auVar172._12_4_;
            iVar33 = movmskps(iVar33,auVar75);
            if (iVar33 != 0) {
              valid.field_0.i[0] = auVar75._0_4_ & -(uint)(auVar208._0_4_ != 0.0);
              valid.field_0.i[1] = auVar75._4_4_ & -(uint)(auVar208._4_4_ != 0.0);
              valid.field_0.i[2] = auVar75._8_4_ & -(uint)(auVar208._8_4_ != 0.0);
              valid.field_0.i[3] = auVar75._12_4_ & -(uint)(auVar208._12_4_ != 0.0);
              iVar33 = movmskps(iVar33,(undefined1  [16])valid.field_0);
              if (iVar33 != 0) {
                uStack_1300._0_4_ = *(float *)(local_1108 + 0x18);
                uVar15 = *(undefined4 *)(local_1108 + 0x1c);
                uStack_12c0 = auVar171._8_8_;
                tNear.field_0._8_8_ = uStack_12c0;
                tNear.field_0._0_8_ = auVar171._0_8_;
                local_1158 = auVar190;
                pGVar18 = (context->scene->geometries).items[(uint)(float)uStack_1300].ptr;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar61 = *(undefined1 (*) [16])local_1250;
                  auVar103 = auVar61._0_12_;
                  auVar135 = *(undefined1 (*) [16])(local_1250 + uVar36 * 4);
                  auVar86 = auVar135._0_12_;
                  if (uVar36 == 2) {
                    auVar103._0_8_ = auVar61._0_8_;
                    auVar103._8_4_ = auVar61._4_4_;
                    auVar86._0_8_ = auVar135._0_8_;
                    auVar86._8_4_ = auVar135._4_4_;
                  }
                  auVar61 = rcpps(auVar123,_local_1238);
                  fVar203 = auVar61._0_4_;
                  fVar50 = auVar61._4_4_;
                  fVar81 = auVar61._8_4_;
                  fVar82 = auVar61._12_4_;
                  fVar203 = (float)(-(uint)(1e-18 <= local_1118) &
                                   (uint)(((float)DAT_01f7ba10 - (float)local_1238._0_4_ * fVar203)
                                          * fVar203 + fVar203));
                  fVar50 = (float)(-(uint)(1e-18 <= fStack_1114) &
                                  (uint)((DAT_01f7ba10._4_4_ - (float)local_1238._4_4_ * fVar50) *
                                         fVar50 + fVar50));
                  fVar81 = (float)(-(uint)(1e-18 <= fStack_1110) &
                                  (uint)((DAT_01f7ba10._8_4_ - fStack_1230 * fVar81) * fVar81 +
                                        fVar81));
                  fVar82 = (float)(-(uint)(1e-18 <= fStack_110c) &
                                  (uint)((DAT_01f7ba10._12_4_ - fStack_122c * fVar82) * fVar82 +
                                        fVar82));
                  auVar173._0_4_ = fVar169 * fVar203;
                  auVar173._4_4_ = fVar175 * fVar50;
                  auVar173._8_4_ = auVar171._8_4_ * fVar81;
                  auVar173._12_4_ = auVar171._12_4_ * fVar82;
                  auVar183 = minps(auVar173,_DAT_01f7ba10);
                  auVar152._0_4_ = (float)local_10e8._0_4_ * fVar203;
                  auVar152._4_4_ = (float)local_10e8._4_4_ * fVar50;
                  auVar152._8_4_ = fStack_10e0 * fVar81;
                  auVar152._12_4_ = fStack_10dc * fVar82;
                  auVar117 = minps(auVar152,_DAT_01f7ba10);
                  auVar110._4_4_ = auVar103._4_4_;
                  auVar125._0_8_ = auVar103._0_8_;
                  auVar110._8_4_ = auVar103._8_4_;
                  auVar125._8_4_ = auVar110._4_4_;
                  uVar84 = auVar86._4_4_;
                  auVar125._12_4_ = uVar84;
                  uVar32 = auVar86._0_4_;
                  auVar124._8_8_ = auVar125._8_8_;
                  auVar124._0_4_ = auVar103._0_4_;
                  auVar124._4_4_ = uVar32;
                  auVar110._0_4_ = auVar110._4_4_;
                  auVar110._12_4_ = auVar110._8_4_;
                  auVar92._0_8_ = auVar86._0_8_;
                  auVar92._8_4_ = uVar84;
                  auVar92._12_4_ = auVar86._8_4_;
                  auVar104 = pblendw(auVar124,ZEXT816(0),0xaa);
                  auVar135 = pblendw(auVar110,ZEXT816(0),0xaa);
                  auVar61 = pblendw(auVar92,ZEXT816(0),0xaa);
                  fVar130 = auVar183._0_4_;
                  fVar131 = auVar183._4_4_;
                  fVar101 = auVar183._8_4_;
                  fVar141 = auVar183._12_4_;
                  fVar112 = auVar117._0_4_;
                  fVar115 = auVar117._4_4_;
                  fVar116 = auVar117._8_4_;
                  fVar129 = auVar117._12_4_;
                  fVar203 = ((float)DAT_01f7ba10 - fVar130) - fVar112;
                  fVar50 = (DAT_01f7ba10._4_4_ - fVar131) - fVar115;
                  fVar81 = (DAT_01f7ba10._8_4_ - fVar101) - fVar116;
                  fVar82 = (DAT_01f7ba10._12_4_ - fVar141) - fVar129;
                  local_1178[0] =
                       (float)auVar104._0_4_ * 0.00012207031 * fVar203 +
                       (float)auVar61._0_4_ * 0.00012207031 * fVar112 +
                       (float)auVar135._0_4_ * 0.00012207031 * fVar130;
                  local_1178[1] =
                       (float)auVar104._4_4_ * 0.00012207031 * fVar50 +
                       (float)auVar61._4_4_ * 0.00012207031 * fVar115 +
                       (float)auVar135._4_4_ * 0.00012207031 * fVar131;
                  local_1178[2] =
                       (float)auVar104._8_4_ * 0.00012207031 * fVar81 +
                       (float)auVar61._8_4_ * 0.00012207031 * fVar116 +
                       (float)auVar135._8_4_ * 0.00012207031 * fVar101;
                  local_1178[3] =
                       (float)auVar104._12_4_ * 0.00012207031 * fVar82 +
                       (float)auVar61._12_4_ * 0.00012207031 * fVar129 +
                       (float)auVar135._12_4_ * 0.00012207031 * fVar141;
                  local_1168[0] =
                       fVar203 * (float)(auVar124._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar32 >> 0x10) * 0.00012207031 * fVar112 +
                       (float)(auVar110._4_4_ >> 0x10) * 0.00012207031 * fVar130;
                  local_1168[1] =
                       fVar50 * (float)(uVar32 >> 0x10) * 0.00012207031 +
                       (float)(uVar84 >> 0x10) * 0.00012207031 * fVar115 +
                       (float)(auVar110._4_4_ >> 0x10) * 0.00012207031 * fVar131;
                  local_1168[2] =
                       fVar81 * (float)(auVar110._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar84 >> 0x10) * 0.00012207031 * fVar116 +
                       (float)(auVar110._8_4_ >> 0x10) * 0.00012207031 * fVar101;
                  local_1168[3] =
                       fVar82 * (float)(uVar84 >> 0x10) * 0.00012207031 +
                       (float)(auVar86._8_4_ >> 0x10) * 0.00012207031 * fVar129 +
                       (float)(auVar110._8_4_ >> 0x10) * 0.00012207031 * fVar141;
                  auVar135 = blendvps(_DAT_01f7a9f0,auVar190,(undefined1  [16])valid.field_0);
                  auVar126._4_4_ = auVar135._0_4_;
                  auVar126._0_4_ = auVar135._4_4_;
                  auVar126._8_4_ = auVar135._12_4_;
                  auVar126._12_4_ = auVar135._8_4_;
                  auVar61 = minps(auVar126,auVar135);
                  auVar93._0_8_ = auVar61._8_8_;
                  auVar93._8_4_ = auVar61._0_4_;
                  auVar93._12_4_ = auVar61._4_4_;
                  auVar61 = minps(auVar93,auVar61);
                  uVar45 = -(uint)(auVar61._0_4_ == auVar135._0_4_);
                  uVar44 = -(uint)(auVar61._4_4_ == auVar135._4_4_);
                  uVar46 = -(uint)(auVar61._8_4_ == auVar135._8_4_);
                  uVar47 = -(uint)(auVar61._12_4_ == auVar135._12_4_);
                  auVar111._0_4_ = uVar45 & valid.field_0.i[0];
                  auVar111._4_4_ = uVar44 & valid.field_0.i[1];
                  auVar111._8_4_ = uVar46 & valid.field_0.i[2];
                  auVar111._12_4_ = uVar47 & valid.field_0.i[3];
                  iVar33 = movmskps((int)local_1250,auVar111);
                  uVar32 = 0xffffffff;
                  uVar84 = 0xffffffff;
                  uVar100 = 0xffffffff;
                  uVar114 = 0xffffffff;
                  if (iVar33 != 0) {
                    uVar32 = uVar45;
                    uVar84 = uVar44;
                    uVar100 = uVar46;
                    uVar114 = uVar47;
                  }
                  auVar76._0_4_ = valid.field_0.i[0] & uVar32;
                  auVar76._4_4_ = valid.field_0.i[1] & uVar84;
                  auVar76._8_4_ = valid.field_0.i[2] & uVar100;
                  auVar76._12_4_ = valid.field_0.i[3] & uVar114;
                  uVar35 = movmskps(iVar33,auVar76);
                  uVar34 = CONCAT44((int)((ulong)local_1250 >> 0x20),uVar35);
                  lVar39 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar49 = local_1178[lVar39];
                    fVar203 = local_1168[lVar39];
                    uVar35 = *(undefined4 *)(local_1148 + lVar39 * 4);
                    uVar13 = *(undefined4 *)(local_1138 + lVar39 * 4);
                    uVar14 = *(undefined4 *)(local_1128 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar35;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                    *(float *)(ray + k * 4 + 0xf0) = fVar49;
                    *(float *)(ray + k * 4 + 0x100) = fVar203;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar15;
                    *(float *)(ray + k * 4 + 0x120) = (float)uStack_1300;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_1308 = CONCAT44((float)uStack_1300,(float)uStack_1300);
                    uStack_1300._4_4_ = (float)uStack_1300;
                    auVar61 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar29);
                    local_1248 = uVar36;
                    while( true ) {
                      local_1098 = local_1178[lVar39];
                      fVar203 = local_1168[lVar39];
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar39 * 4)
                      ;
                      args.context = context->user;
                      local_1088._4_4_ = fVar203;
                      local_1088._0_4_ = fVar203;
                      local_1088._8_4_ = fVar203;
                      local_1088._12_4_ = fVar203;
                      local_10c8 = *(undefined4 *)(local_1148 + lVar39 * 4);
                      uVar35 = *(undefined4 *)(local_1138 + lVar39 * 4);
                      uVar13 = *(undefined4 *)(local_1128 + lVar39 * 4);
                      local_10b8._4_4_ = uVar35;
                      local_10b8._0_4_ = uVar35;
                      local_10b8._8_4_ = uVar35;
                      local_10b8._12_4_ = uVar35;
                      local_10a8._4_4_ = uVar13;
                      local_10a8._0_4_ = uVar13;
                      local_10a8._8_4_ = uVar13;
                      local_10a8._12_4_ = uVar13;
                      uStack_10c4 = local_10c8;
                      uStack_10c0 = local_10c8;
                      uStack_10bc = local_10c8;
                      fStack_1094 = local_1098;
                      fStack_1090 = local_1098;
                      fStack_108c = local_1098;
                      local_1078 = CONCAT44(uVar15,uVar15);
                      uStack_1070 = CONCAT44(uVar15,uVar15);
                      local_1068 = local_1308;
                      uStack_1060 = uStack_1300;
                      local_1058 = (args.context)->instID[0];
                      uStack_1054 = local_1058;
                      uStack_1050 = local_1058;
                      uStack_104c = local_1058;
                      local_1048 = (args.context)->instPrimID[0];
                      uStack_1044 = local_1048;
                      uStack_1040 = local_1048;
                      uStack_103c = local_1048;
                      args.valid = (int *)local_1268;
                      args.geometryUserPtr = pGVar18->userPtr;
                      args.hit = (RTCHitN *)&local_10c8;
                      args.N = 4;
                      pRVar31 = (RTCRayN *)pGVar18->intersectionFilterN;
                      local_1268 = auVar61;
                      args.ray = (RTCRayN *)ray;
                      if (pRVar31 != (RTCRayN *)0x0) {
                        pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                      }
                      if (local_1268 == (undefined1  [16])0x0) {
                        auVar97._8_4_ = 0xffffffff;
                        auVar97._0_8_ = 0xffffffffffffffff;
                        auVar97._12_4_ = 0xffffffff;
                        auVar97 = auVar97 ^ _DAT_01f7ae20;
                      }
                      else {
                        pRVar31 = (RTCRayN *)context->args->filter;
                        if ((pRVar31 != (RTCRayN *)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                        }
                        auVar79._0_4_ = -(uint)(local_1268._0_4_ == 0);
                        auVar79._4_4_ = -(uint)(local_1268._4_4_ == 0);
                        auVar79._8_4_ = -(uint)(local_1268._8_4_ == 0);
                        auVar79._12_4_ = -(uint)(local_1268._12_4_ == 0);
                        auVar97 = auVar79 ^ _DAT_01f7ae20;
                        if (local_1268 != (undefined1  [16])0x0) {
                          auVar135 = blendvps(*(undefined1 (*) [16])args.hit,
                                              *(undefined1 (*) [16])(args.ray + 0xc0),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                              *(undefined1 (*) [16])(args.ray + 0xd0),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                              *(undefined1 (*) [16])(args.ray + 0xe0),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                              *(undefined1 (*) [16])(args.ray + 0xf0),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                              *(undefined1 (*) [16])(args.ray + 0x100),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                              *(undefined1 (*) [16])(args.ray + 0x110),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                              *(undefined1 (*) [16])(args.ray + 0x120),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                              *(undefined1 (*) [16])(args.ray + 0x130),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar135;
                          auVar135 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                              *(undefined1 (*) [16])(args.ray + 0x140),auVar79);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar135;
                          pRVar31 = args.ray;
                        }
                      }
                      if ((_DAT_01f7bb20 & auVar97) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar49;
                      }
                      else {
                        fVar49 = *(float *)(ray + k * 4 + 0x80);
                      }
                      *(undefined4 *)(local_1268 + lVar39 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(auVar190._0_4_ <= fVar49) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(auVar190._4_4_ <= fVar49) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(auVar190._8_4_ <= fVar49) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(auVar190._12_4_ <= fVar49) & valid.field_0.i[3];
                      iVar33 = movmskps((int)pRVar31,(undefined1  [16])valid.field_0);
                      if (iVar33 == 0) break;
                      auVar104 = blendvps(_DAT_01f7a9f0,auVar190,(undefined1  [16])valid.field_0);
                      auVar128._4_4_ = auVar104._0_4_;
                      auVar128._0_4_ = auVar104._4_4_;
                      auVar128._8_4_ = auVar104._12_4_;
                      auVar128._12_4_ = auVar104._8_4_;
                      auVar135 = minps(auVar128,auVar104);
                      auVar98._0_8_ = auVar135._8_8_;
                      auVar98._8_4_ = auVar135._0_4_;
                      auVar98._12_4_ = auVar135._4_4_;
                      auVar135 = minps(auVar98,auVar135);
                      auVar99._0_8_ =
                           CONCAT44(-(uint)(auVar135._4_4_ == auVar104._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar135._0_4_ == auVar104._0_4_) & valid.field_0.i[0]);
                      auVar99._8_4_ = -(uint)(auVar135._8_4_ == auVar104._8_4_) & valid.field_0.i[2]
                      ;
                      auVar99._12_4_ =
                           -(uint)(auVar135._12_4_ == auVar104._12_4_) & valid.field_0.i[3];
                      iVar33 = movmskps(iVar33,auVar99);
                      aVar80 = valid.field_0;
                      if (iVar33 != 0) {
                        aVar80.i[2] = auVar99._8_4_;
                        aVar80._0_8_ = auVar99._0_8_;
                        aVar80.i[3] = auVar99._12_4_;
                      }
                      uVar35 = movmskps(iVar33,(undefined1  [16])aVar80);
                      uVar34 = CONCAT44((int)((ulong)pRVar31 >> 0x20),uVar35);
                      lVar39 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar135._4_4_ = uVar15;
        auVar135._0_4_ = uVar15;
        auVar135._8_4_ = uVar15;
        auVar135._12_4_ = uVar15;
        fVar115 = local_fd8;
        fVar116 = fStack_fd4;
        fVar129 = fStack_fd0;
        fVar49 = fStack_fcc;
        fVar130 = local_fe8;
        fVar131 = fStack_fe4;
        fVar101 = fStack_fe0;
        fVar203 = fStack_fdc;
        auVar61 = local_1038;
        fVar141 = local_ff8;
        fVar147 = fStack_ff4;
        fVar155 = fStack_ff0;
        fVar50 = fStack_fec;
        fVar113 = local_1008;
        fVar153 = fStack_1004;
        fVar157 = fStack_1000;
        fVar81 = fStack_ffc;
        fVar159 = local_1018;
        fVar154 = fStack_1014;
        fVar158 = fStack_1010;
        fVar82 = fStack_100c;
        fVar162 = local_1028;
        fVar165 = fStack_1024;
        fVar166 = fStack_1020;
        fVar112 = fStack_101c;
      }
      else {
        sVar19 = *(size_t *)*(GridSOA **)(uVar34 & 0xfffffffffffffff0);
        (local_1258->super_Precalculations).grid = *(GridSOA **)(uVar34 & 0xfffffffffffffff0);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar135._4_4_ = uVar15;
        auVar135._0_4_ = uVar15;
        auVar135._8_4_ = uVar15;
        auVar135._12_4_ = uVar15;
        if (sVar19 != 0) {
          (pSVar30->ptr).ptr = sVar19;
          pSVar30->dist = 0;
          pSVar30 = pSVar30 + 1;
        }
      }
    }
    if (pSVar30 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }